

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tokenizer.cc
# Opt level: O2

void __thiscall Finder::Finder(Finder *this,shared_ptr<InputSource> *is,string *str)

{
  (this->super_Finder)._vptr_Finder = (_func_int **)&PTR__Finder_00108c30;
  std::__shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->is).super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>,
             &is->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>);
  std::__cxx11::string::string((string *)&this->str,(string *)str);
  return;
}

Assistant:

Finder(std::shared_ptr<InputSource> is, std::string const& str) :
        is(is),
        str(str)
    {
    }